

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O1

int testUTF8(int param_1,char **param_2)

{
  test_utf8_entry *ptVar1;
  test_utf8_char *first;
  char *pcVar2;
  int iVar3;
  byte unaff_R12B;
  uint uVar4;
  test_utf8_entry *e;
  test_utf8_entry *ptVar5;
  char *pcVar6;
  bool bVar7;
  uint uc;
  uint local_44;
  undefined8 local_40;
  undefined8 uStack_38;
  
  ptVar5 = good_entry;
  pcVar6 = (char *)((long)&local_40 + 4);
  iVar3 = 0;
  do {
    local_40._0_4_ = ptVar5->n;
    local_40._4_1_ = ptVar5->str[0];
    local_40._5_1_ = ptVar5->str[1];
    local_40._6_1_ = ptVar5->str[2];
    local_40._7_1_ = ptVar5->str[3];
    uStack_38 = *(ulong *)(ptVar5->str + 4);
    pcVar2 = cm_utf8_decode_character(pcVar6,(char *)&uStack_38,&local_44);
    if (pcVar2 != (char *)0x0) {
      if (local_44 == uStack_38._4_4_) {
        uVar4 = (int)pcVar2 - (int)pcVar6;
        bVar7 = (uint)local_40 != uVar4;
        if (bVar7) {
          report_good(false,pcVar6);
          printf("had %d bytes, used %d\n",local_40 & 0xffffffff,(ulong)uVar4);
        }
        else {
          report_good(true,pcVar6);
          printf("got 0x%04X\n",(ulong)local_44);
        }
        unaff_R12B = !bVar7;
      }
      else {
        unaff_R12B = 0;
        report_good(false,pcVar6);
        printf("expected 0x%04X, got 0x%04X\n",uStack_38 >> 0x20,(ulong)local_44);
      }
    }
    if (pcVar2 == (char *)0x0) {
      unaff_R12B = 0;
      report_good(false,pcVar6);
      puts("failed");
    }
    if ((unaff_R12B & 1) == 0) {
      iVar3 = 1;
    }
    ptVar1 = ptVar5 + 1;
    ptVar5 = ptVar5 + 1;
  } while (ptVar1->n != 0);
  pcVar6 = bad_chars[0] + 4;
  do {
    first = (test_utf8_char *)(pcVar6 + -4);
    local_40 = CONCAT44(local_40._4_4_,0xffff);
    pcVar2 = cm_utf8_decode_character((char *)first,pcVar6,(uint *)&local_40);
    if (pcVar2 == (char *)0x0) {
      report_bad(true,(char *)first);
      puts("failed as expected");
    }
    else {
      report_bad(false,(char *)first);
      printf("expected failure, got 0x%04X\n",local_40 & 0xffffffff);
      iVar3 = 1;
    }
    pcVar2 = pcVar6 + 1;
    pcVar6 = pcVar6 + 5;
  } while (*pcVar2 != '\0');
  return iVar3;
}

Assistant:

int testUTF8(int, char*[])
{
  int result = 0;
  for(test_utf8_entry const* e = good_entry; e->n; ++e)
    {
    if(!decode_good(*e))
      {
      result = 1;
      }
    }
  for(test_utf8_char const* c = bad_chars; (*c)[0]; ++c)
    {
    if(!decode_bad(*c))
      {
      result = 1;
      }
    }
  return result;
}